

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsTagCompare(FmsTag lhs,FmsTag rhs)

{
  int iVar1;
  FmsInt FVar2;
  long *in_RSI;
  long *in_RDI;
  FmsInt ne;
  FmsComponent in_stack_00000008;
  int diff;
  void *in_stack_00000060;
  void *in_stack_00000068;
  FmsInt in_stack_00000070;
  FmsIntType in_stack_0000007c;
  uint local_1c;
  uint local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else if (in_RDI == (long *)0x0) {
    local_4 = 0xffffffff;
  }
  else if (in_RSI == (long *)0x0) {
    local_4 = 0xfffffffe;
  }
  else {
    local_1c = 0;
    if ((*in_RDI == 0) || (*in_RSI == 0)) {
      if (*in_RDI == 0) {
        local_1c = 2;
      }
      else if (*in_RSI == 0) {
        local_1c = 3;
      }
    }
    else {
      iVar1 = strcmp((char *)*in_RDI,(char *)*in_RSI);
      local_1c = (uint)(iVar1 != 0);
    }
    if ((int)in_RDI[3] != (int)in_RSI[3]) {
      local_1c = local_1c + 10;
    }
    if (in_RDI[2] != in_RSI[2]) {
      local_1c = local_1c + 0x14;
    }
    if ((local_1c == 0) &&
       (iVar1 = FmsComponentCompare(in_stack_00000008,(FmsComponent)ne), iVar1 != 0)) {
      local_1c = 100;
    }
    if ((local_1c == 0) &&
       (FVar2 = CompareIntData(in_stack_0000007c,in_stack_00000070,in_stack_00000068,
                               in_stack_00000060), FVar2 != 0)) {
      local_1c = 1000;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int FmsTagCompare(FmsTag lhs, FmsTag rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;

  if(lhs->tag_type != rhs->tag_type)
    diff += 10;

  if(lhs->num_tag_descriptions != rhs->num_tag_descriptions)
    diff += 20;

  if(diff == 0) {
    if(FmsComponentCompare(lhs->comp, rhs->comp))
      diff += 100;
  }

  if(diff == 0) {
    FmsInt ne = lhs->comp->num_main_entities;
    if(CompareIntData(lhs->tag_type, ne, lhs->tags, rhs->tags))
      diff += 1000;
  }

  return diff;
}